

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::iterator::skip_empty(iterator *this)

{
  Inner *pIVar1;
  char cVar2;
  Inner *pIVar3;
  char *pcVar4;
  slot_type *psVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [12];
  undefined1 auVar15 [13];
  undefined1 auVar16 [14];
  Inner *pIVar17;
  char *pcVar18;
  uint uVar19;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  
  if ((this->it_).ctrl_ == (this->it_end_).ctrl_) {
    pIVar3 = this->inner_end_;
    pIVar17 = this->inner_;
    do {
      pIVar1 = pIVar17 + 1;
      this->inner_ = pIVar1;
      if (pIVar1 == pIVar3) {
        this->inner_ = (Inner *)0x0;
        return;
      }
      pcVar4 = pIVar17[1].set_.ctrl_;
      psVar5 = pIVar17[1].set_.slots_;
      cVar2 = *pcVar4;
      while (cVar2 < -1) {
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar4 < (char)iVar9);
        in_XMM1_Bb = -(pcVar4[1] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bc = -(pcVar4[2] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bd = -(pcVar4[3] < (char)((uint)iVar9 >> 0x18));
        in_XMM1_Be = -(pcVar4[4] < (char)iVar10);
        in_XMM1_Bf = -(pcVar4[5] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bg = -(pcVar4[6] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bh = -(pcVar4[7] < (char)((uint)iVar10 >> 0x18));
        in_XMM1_Bi = -(pcVar4[8] < (char)iVar11);
        in_XMM1_Bj = -(pcVar4[9] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bk = -(pcVar4[10] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bl = -(pcVar4[0xb] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Bm = -(pcVar4[0xc] < (char)iVar12);
        in_XMM1_Bn = -(pcVar4[0xd] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bo = -(pcVar4[0xe] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bp = -(pcVar4[0xf] < (char)((uint)iVar12 >> 0x18));
        auVar7[1] = in_XMM1_Bb;
        auVar7[0] = in_XMM1_Ba;
        auVar7[2] = in_XMM1_Bc;
        auVar7[3] = in_XMM1_Bd;
        auVar7[4] = in_XMM1_Be;
        auVar7[5] = in_XMM1_Bf;
        auVar7[6] = in_XMM1_Bg;
        auVar7[7] = in_XMM1_Bh;
        auVar7[8] = in_XMM1_Bi;
        auVar7[9] = in_XMM1_Bj;
        auVar7[10] = in_XMM1_Bk;
        auVar7[0xb] = in_XMM1_Bl;
        auVar7[0xc] = in_XMM1_Bm;
        auVar7[0xd] = in_XMM1_Bn;
        auVar7[0xe] = in_XMM1_Bo;
        auVar7[0xf] = in_XMM1_Bp;
        auVar8[1] = in_XMM1_Bb;
        auVar8[0] = in_XMM1_Ba;
        auVar8[2] = in_XMM1_Bc;
        auVar8[3] = in_XMM1_Bd;
        auVar8[4] = in_XMM1_Be;
        auVar8[5] = in_XMM1_Bf;
        auVar8[6] = in_XMM1_Bg;
        auVar8[7] = in_XMM1_Bh;
        auVar8[8] = in_XMM1_Bi;
        auVar8[9] = in_XMM1_Bj;
        auVar8[10] = in_XMM1_Bk;
        auVar8[0xb] = in_XMM1_Bl;
        auVar8[0xc] = in_XMM1_Bm;
        auVar8[0xd] = in_XMM1_Bn;
        auVar8[0xe] = in_XMM1_Bo;
        auVar8[0xf] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bd;
        auVar16[0] = in_XMM1_Bc;
        auVar16[2] = in_XMM1_Be;
        auVar16[3] = in_XMM1_Bf;
        auVar16[4] = in_XMM1_Bg;
        auVar16[5] = in_XMM1_Bh;
        auVar16[6] = in_XMM1_Bi;
        auVar16[7] = in_XMM1_Bj;
        auVar16[8] = in_XMM1_Bk;
        auVar16[9] = in_XMM1_Bl;
        auVar16[10] = in_XMM1_Bm;
        auVar16[0xb] = in_XMM1_Bn;
        auVar16[0xc] = in_XMM1_Bo;
        auVar16[0xd] = in_XMM1_Bp;
        auVar15[1] = in_XMM1_Be;
        auVar15[0] = in_XMM1_Bd;
        auVar15[2] = in_XMM1_Bf;
        auVar15[3] = in_XMM1_Bg;
        auVar15[4] = in_XMM1_Bh;
        auVar15[5] = in_XMM1_Bi;
        auVar15[6] = in_XMM1_Bj;
        auVar15[7] = in_XMM1_Bk;
        auVar15[8] = in_XMM1_Bl;
        auVar15[9] = in_XMM1_Bm;
        auVar15[10] = in_XMM1_Bn;
        auVar15[0xb] = in_XMM1_Bo;
        auVar15[0xc] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bf;
        auVar14[0] = in_XMM1_Be;
        auVar14[2] = in_XMM1_Bg;
        auVar14[3] = in_XMM1_Bh;
        auVar14[4] = in_XMM1_Bi;
        auVar14[5] = in_XMM1_Bj;
        auVar14[6] = in_XMM1_Bk;
        auVar14[7] = in_XMM1_Bl;
        auVar14[8] = in_XMM1_Bm;
        auVar14[9] = in_XMM1_Bn;
        auVar14[10] = in_XMM1_Bo;
        auVar14[0xb] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Bg;
        auVar13[0] = in_XMM1_Bf;
        auVar13[2] = in_XMM1_Bh;
        auVar13[3] = in_XMM1_Bi;
        auVar13[4] = in_XMM1_Bj;
        auVar13[5] = in_XMM1_Bk;
        auVar13[6] = in_XMM1_Bl;
        auVar13[7] = in_XMM1_Bm;
        auVar13[8] = in_XMM1_Bn;
        auVar13[9] = in_XMM1_Bo;
        auVar13[10] = in_XMM1_Bp;
        uVar19 = (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar16 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar15 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar14 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar6 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        psVar5 = psVar5 + uVar6;
        cVar2 = pcVar4[uVar6];
        pcVar4 = pcVar4 + uVar6;
      }
      (this->it_).ctrl_ = pcVar4;
      (this->it_).field_1.slot_ = psVar5;
      pcVar18 = pIVar17[1].set_.ctrl_ + pIVar17[1].set_.capacity_;
      (this->it_end_).ctrl_ = pcVar18;
      pIVar17 = pIVar1;
    } while (pcVar4 == pcVar18);
  }
  return;
}

Assistant:

void skip_empty() {
            while (it_ == it_end_) {
                ++inner_;
                if (inner_ == inner_end_) {
                    inner_ = nullptr; // marks end()
                    break;
                }
                else {
                    it_ = inner_->set_.begin();
                    it_end_ = inner_->set_.end();
                }
            }
        }